

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls12_server.c
# Opt level: O3

int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl,uchar **p,uchar *end)

{
  mbedtls_ssl_config *pmVar1;
  int iVar2;
  ushort *puVar3;
  ushort uVar4;
  ulong n;
  
  pmVar1 = ssl->conf;
  if ((pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) &&
     ((((pmVar1->psk_identity_len == 0 || (pmVar1->psk_identity == (uchar *)0x0)) ||
       (pmVar1->psk == (uchar *)0x0)) || (pmVar1->psk_len == 0)))) {
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,0xe00,"got no pre-shared key");
    return -0x7600;
  }
  puVar3 = (ushort *)*p;
  if ((long)end - (long)puVar3 < 2) {
    iVar2 = 0xe08;
LAB_001ab9d8:
    mbedtls_debug_print_msg
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
               ,iVar2,"bad client key exchange message");
    return -0x7300;
  }
  uVar4 = *puVar3 << 8 | *puVar3 >> 8;
  puVar3 = puVar3 + 1;
  *p = (uchar *)puVar3;
  if ((uVar4 == 0) || (n = (ulong)uVar4, (long)end - (long)puVar3 < (long)n)) {
    iVar2 = 0xe10;
    goto LAB_001ab9d8;
  }
  pmVar1 = ssl->conf;
  if (pmVar1->f_psk == (_func_int_void_ptr_mbedtls_ssl_context_ptr_uchar_ptr_size_t *)0x0) {
    if (pmVar1->psk_identity_len != n) goto LAB_001aba2c;
    iVar2 = mbedtls_ct_memcmp(pmVar1->psk_identity,puVar3,n);
  }
  else {
    iVar2 = (*pmVar1->f_psk)(pmVar1->p_psk,ssl,(uchar *)puVar3,n);
  }
  if (iVar2 == 0) {
    *p = *p + n;
    return 0;
  }
LAB_001aba2c:
  mbedtls_debug_print_buf
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls12_server.c"
             ,0xe22,"Unknown PSK identity",*p,n);
  mbedtls_ssl_send_alert_message(ssl,'\x02','s');
  return -0x6c80;
}

Assistant:

MBEDTLS_CHECK_RETURN_CRITICAL
static int ssl_parse_client_psk_identity(mbedtls_ssl_context *ssl, unsigned char **p,
                                         const unsigned char *end)
{
    int ret = 0;
    uint16_t n;

    if (ssl_conf_has_psk_or_cb(ssl->conf) == 0) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("got no pre-shared key"));
        return MBEDTLS_ERR_SSL_PRIVATE_KEY_REQUIRED;
    }

    /*
     * Receive client pre-shared key identity name
     */
    if (end - *p < 2) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad client key exchange message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    n = ((*p)[0] << 8) | (*p)[1];
    *p += 2;

    if (n == 0 || n > end - *p) {
        MBEDTLS_SSL_DEBUG_MSG(1, ("bad client key exchange message"));
        return MBEDTLS_ERR_SSL_DECODE_ERROR;
    }

    if (ssl->conf->f_psk != NULL) {
        if (ssl->conf->f_psk(ssl->conf->p_psk, ssl, *p, n) != 0) {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    } else {
        /* Identity is not a big secret since clients send it in the clear,
         * but treat it carefully anyway, just in case */
        if (n != ssl->conf->psk_identity_len ||
            mbedtls_ct_memcmp(ssl->conf->psk_identity, *p, n) != 0) {
            ret = MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
        }
    }

    if (ret == MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY) {
        MBEDTLS_SSL_DEBUG_BUF(3, "Unknown PSK identity", *p, n);
        mbedtls_ssl_send_alert_message(ssl, MBEDTLS_SSL_ALERT_LEVEL_FATAL,
                                       MBEDTLS_SSL_ALERT_MSG_UNKNOWN_PSK_IDENTITY);
        return MBEDTLS_ERR_SSL_UNKNOWN_IDENTITY;
    }

    *p += n;

    return 0;
}